

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
Serializer::report_exception(Serializer *this,long lineNo,string *expression,exception_ptr *e)

{
  ostream *poVar1;
  undefined8 uVar2;
  int *piVar3;
  undefined8 *puVar4;
  long *plVar5;
  int iVar6;
  undefined1 auVar7 [12];
  void *local_38;
  char *local_30;
  
  local_38 = e->_M_exception_object;
  if (local_38 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  auVar7 = std::rethrow_exception((exception_ptr)&local_38);
  iVar6 = auVar7._8_4_;
  uVar2 = auVar7._0_8_;
  if (local_38 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (iVar6 == 4) {
    piVar3 = (int *)__cxa_begin_catch(uVar2);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os,"Caught an int \'",0xf)
    ;
    std::ostream::operator<<((ostream *)(this->super_raw)._os,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os,"\'",1);
    this->caughtInt = true;
  }
  else if (iVar6 == 3) {
    puVar4 = (undefined8 *)__cxa_begin_catch(uVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_raw)._os,"Caught a std::string \'",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_raw)._os,(char *)*puVar4,puVar4[1]);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os,"\'",1);
    this->caughtString = true;
  }
  else {
    plVar5 = (long *)__cxa_begin_catch(uVar2);
    poVar1 = (this->super_raw)._os;
    if (iVar6 == 2) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Caught a std::exception \'",0x19);
      local_30 = (char *)(**(code **)(*plVar5 + 0x10))(plVar5);
      kiste::raw::escape<char_const*>(&this->super_raw,&local_30);
      std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os,"\'",1);
      this->caughtException = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Caught an unknown exception",0x1b);
    }
  }
  __cxa_end_catch();
  std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os," at line ",9);
  std::ostream::_M_insert<long>((long)(this->super_raw)._os);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os," in expression(",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_raw)._os,(expression->_M_dataplus)._M_p,expression->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_raw)._os,")",1);
  return;
}

Assistant:

void report_exception(long lineNo, const std::string& expression, std::exception_ptr e)
  {
    try
    {
      std::rethrow_exception(e);
    }
    catch (const int& e)
    {
      text("Caught an int '");
      escape(e);
      text("'");
      caughtInt = true;
    }
    catch (const std::string& e)
    {
      text("Caught a std::string '");
      escape(e);
      text("'");
      caughtString = true;
    }
    catch (const std::exception& e)
    {
      text("Caught a std::exception '");
      escape(e.what());
      text("'");
      caughtException = true;
    }
    catch (...)
    {
      text("Caught an unknown exception");
    }
    text(" at line ");
    escape(lineNo);
    text(" in expression(");
    escape(expression);
    text(")");
  }